

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

int run_container_to_uint32_array(void *vout,run_container_t *cont,uint32_t base)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  int i;
  long lVar4;
  int iVar5;
  long lVar6;
  
  iVar3 = 0;
  for (lVar4 = 0; lVar4 < cont->n_runs; lVar4 = lVar4 + 1) {
    uVar1 = cont->runs[lVar4].value;
    uVar2 = cont->runs[lVar4].length;
    for (lVar6 = 0; iVar5 = (int)lVar6, uVar2 + 1 != iVar5; lVar6 = lVar6 + 1) {
      *(uint *)((long)vout + lVar6 * 4 + (long)iVar3 * 4) = uVar1 + base + iVar5;
    }
    iVar3 = iVar3 + iVar5;
  }
  return iVar3;
}

Assistant:

int run_container_to_uint32_array(void *vout, const run_container_t *cont,
                                  uint32_t base) {
    int outpos = 0;
    uint32_t *out = (uint32_t *)vout;
    for (int i = 0; i < cont->n_runs; ++i) {
        uint32_t run_start = base + cont->runs[i].value;
        uint16_t le = cont->runs[i].length;
        for (int j = 0; j <= le; ++j) {
            uint32_t val = run_start + j;
            memcpy(out + outpos, &val,
                   sizeof(uint32_t));  // should be compiled as a MOV on x64
            outpos++;
        }
    }
    return outpos;
}